

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O3

bool tinyusdz::detail::OverridePrimSpecRec
               (uint32_t depth,PrimSpec *dst,PrimSpec *src,string *warn,string *err)

{
  pointer pPVar1;
  pointer pPVar2;
  PrimSpec *pPVar3;
  bool bVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  long lVar8;
  _Rb_tree_header *p_Var9;
  pointer pPVar10;
  __normal_iterator<const_tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
  __it;
  PrimSpec *pPVar11;
  __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
  __it_00;
  PrimSpec *child;
  pointer pPVar12;
  __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
  _Var13;
  __normal_iterator<const_tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
  src_00;
  PrimSpec *child_1;
  long lVar14;
  ostringstream ss_e;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (depth < 0x8000001) {
    PrimMetas::update_from(&dst->_metas,&src->_metas,true);
    p_Var7 = (src->_props)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var9 = &(src->_props)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 != p_Var9) {
      do {
        pmVar6 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                 ::operator[](&dst->_props,(key_type *)(p_Var7 + 1));
        ::std::__cxx11::string::_M_assign((string *)pmVar6);
        (pmVar6->_attrib)._varying_authored = (bool)p_Var7[3].field_0x4;
        (pmVar6->_attrib)._variability = p_Var7[3]._M_color;
        ::std::__cxx11::string::_M_assign((string *)&(pmVar6->_attrib)._type_name);
        linb::any::operator=((any *)&(pmVar6->_attrib)._var,(any *)&p_Var7[4]._M_parent);
        (pmVar6->_attrib)._var._blocked = SUB41(p_Var7[5]._M_color,0);
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::operator=(&(pmVar6->_attrib)._var._ts._samples,
                    (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)&p_Var7[5]._M_parent);
        (pmVar6->_attrib)._var._ts._dirty = SUB41(p_Var7[6]._M_color,0);
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &(pmVar6->_attrib)._paths,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&p_Var7[6]._M_parent);
        AttrMetas::operator=(&(pmVar6->_attrib)._metas,(AttrMetas *)(p_Var7 + 7));
        *(_Base_ptr *)&pmVar6->_listOpQual = p_Var7[0x17]._M_parent;
        (pmVar6->_rel).type = *(Type *)&p_Var7[0x17]._M_left;
        Path::operator=(&(pmVar6->_rel).targetPath,(Path *)&p_Var7[0x17]._M_right);
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &(pmVar6->_rel).targetPathVector,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &p_Var7[0x1e]._M_parent);
        (pmVar6->_rel).listOpQual = p_Var7[0x1f]._M_color;
        AttrMetas::operator=(&(pmVar6->_rel)._metas,(AttrMetas *)&p_Var7[0x1f]._M_parent);
        (pmVar6->_rel)._varying_authored = *(bool *)&p_Var7[0x2f]._M_left;
        ::std::__cxx11::string::_M_assign((string *)&pmVar6->_prop_value_type_name);
        pmVar6->_has_custom = *(bool *)&p_Var7[0x30]._M_right;
        p_Var7 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != p_Var9);
    }
    pPVar12 = (dst->_children).
              super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
              super__Vector_impl_data._M_start;
    pPVar1 = (dst->_children).
             super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pPVar12 != pPVar1) {
      do {
        __it._M_current =
             (src->_children).
             super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
             super__Vector_impl_data._M_start;
        pPVar2 = (src->_children).
                 super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        lVar8 = (long)pPVar2 - (long)__it._M_current;
        lVar14 = (lVar8 >> 3) * -0x77dc7c4cf2ae9cdb >> 2;
        if (0 < lVar14) {
          pPVar10 = __it._M_current + lVar14 * 4;
          lVar14 = lVar14 + 1;
          do {
            bVar4 = __gnu_cxx::__ops::
                    _Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                    ::operator()((_Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                  *)pPVar12,__it);
            src_00._M_current = __it._M_current;
            if (bVar4) goto LAB_001af237;
            bVar4 = __gnu_cxx::__ops::
                    _Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                    ::operator()((_Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                  *)pPVar12,__it._M_current + 1);
            src_00._M_current = __it._M_current + 1;
            if (bVar4) goto LAB_001af237;
            bVar4 = __gnu_cxx::__ops::
                    _Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                    ::operator()((_Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                  *)pPVar12,__it._M_current + 2);
            src_00._M_current = __it._M_current + 2;
            if (bVar4) goto LAB_001af237;
            bVar4 = __gnu_cxx::__ops::
                    _Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                    ::operator()((_Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                  *)pPVar12,__it._M_current + 3);
            src_00._M_current = __it._M_current + 3;
            if (bVar4) goto LAB_001af237;
            __it._M_current = __it._M_current + 4;
            lVar14 = lVar14 + -1;
          } while (1 < lVar14);
          lVar8 = (long)pPVar2 - (long)pPVar10;
          __it._M_current = pPVar10;
        }
        lVar8 = (lVar8 >> 3) * -0x77dc7c4cf2ae9cdb;
        if (lVar8 == 1) {
LAB_001af21e:
          bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                  ::operator()((_Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                *)pPVar12,__it);
          src_00._M_current = __it._M_current;
          if (!bVar4) {
            src_00._M_current = pPVar2;
          }
LAB_001af237:
          if ((src_00._M_current != pPVar2) &&
             (bVar4 = OverridePrimSpecRec(depth + 1,pPVar12,src_00._M_current,warn,err), !bVar4))
          goto LAB_001aef52;
        }
        else {
          if (lVar8 == 2) {
LAB_001af208:
            bVar4 = __gnu_cxx::__ops::
                    _Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                    ::operator()((_Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                  *)pPVar12,__it);
            src_00._M_current = __it._M_current;
            if (!bVar4) {
              __it._M_current = __it._M_current + 1;
              goto LAB_001af21e;
            }
            goto LAB_001af237;
          }
          if (lVar8 == 3) {
            bVar4 = __gnu_cxx::__ops::
                    _Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                    ::operator()((_Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                  *)pPVar12,__it);
            src_00._M_current = __it._M_current;
            if (!bVar4) {
              __it._M_current = __it._M_current + 1;
              goto LAB_001af208;
            }
            goto LAB_001af237;
          }
        }
        pPVar12 = pPVar12 + 1;
      } while (pPVar12 != pPVar1);
    }
    pPVar12 = (src->_children).
              super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
              super__Vector_impl_data._M_start;
    pPVar1 = (src->_children).
             super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar4 = true;
    if (pPVar12 != pPVar1) {
      do {
        __it_00._M_current =
             (dst->_children).
             super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
             super__Vector_impl_data._M_start;
        pPVar3 = (dst->_children).
                 super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        lVar8 = (long)pPVar3 - (long)__it_00._M_current;
        lVar14 = (lVar8 >> 3) * -0x77dc7c4cf2ae9cdb >> 2;
        if (0 < lVar14) {
          pPVar11 = __it_00._M_current + lVar14 * 4;
          lVar14 = lVar14 + 1;
          do {
            bVar4 = __gnu_cxx::__ops::
                    _Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_1>
                    ::operator()((_Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__1>
                                  *)pPVar12,__it_00);
            _Var13._M_current = __it_00._M_current;
            if (bVar4) goto LAB_001af3b7;
            bVar4 = __gnu_cxx::__ops::
                    _Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_1>
                    ::operator()((_Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__1>
                                  *)pPVar12,__it_00._M_current + 1);
            _Var13._M_current = __it_00._M_current + 1;
            if (bVar4) goto LAB_001af3b7;
            bVar4 = __gnu_cxx::__ops::
                    _Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_1>
                    ::operator()((_Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__1>
                                  *)pPVar12,__it_00._M_current + 2);
            _Var13._M_current = __it_00._M_current + 2;
            if (bVar4) goto LAB_001af3b7;
            bVar4 = __gnu_cxx::__ops::
                    _Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_1>
                    ::operator()((_Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__1>
                                  *)pPVar12,__it_00._M_current + 3);
            _Var13._M_current = __it_00._M_current + 3;
            if (bVar4) goto LAB_001af3b7;
            __it_00._M_current = __it_00._M_current + 4;
            lVar14 = lVar14 + -1;
          } while (1 < lVar14);
          lVar8 = (long)pPVar3 - (long)pPVar11;
          __it_00._M_current = pPVar11;
        }
        lVar8 = (lVar8 >> 3) * -0x77dc7c4cf2ae9cdb;
        if (lVar8 == 1) {
LAB_001af39e:
          bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_1>
                  ::operator()((_Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__1>
                                *)pPVar12,__it_00);
          _Var13._M_current = __it_00._M_current;
          if (!bVar4) {
            _Var13._M_current = pPVar3;
          }
LAB_001af3b7:
          if (_Var13._M_current == pPVar3) goto LAB_001af3bc;
        }
        else {
          if (lVar8 == 2) {
LAB_001af388:
            bVar4 = __gnu_cxx::__ops::
                    _Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_1>
                    ::operator()((_Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__1>
                                  *)pPVar12,__it_00);
            _Var13._M_current = __it_00._M_current;
            if (!bVar4) {
              __it_00._M_current = __it_00._M_current + 1;
              goto LAB_001af39e;
            }
            goto LAB_001af3b7;
          }
          if (lVar8 == 3) {
            bVar4 = __gnu_cxx::__ops::
                    _Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_1>
                    ::operator()((_Iter_pred<tinyusdz::detail::OverridePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__1>
                                  *)pPVar12,__it_00);
            _Var13._M_current = __it_00._M_current;
            if (!bVar4) {
              __it_00._M_current = __it_00._M_current + 1;
              goto LAB_001af388;
            }
            goto LAB_001af3b7;
          }
LAB_001af3bc:
          ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::push_back
                    (&dst->_children,pPVar12);
        }
        pPVar12 = pPVar12 + 1;
      } while (pPVar12 != pPVar1);
      bVar4 = true;
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"OverridePrimSpecRec",0x13);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x4b2);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"PrimSpec tree too deep.",0x17);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if (warn != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)warn,(ulong)local_1c8);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
    ::std::ios_base::~ios_base(local_138);
LAB_001aef52:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

static bool OverridePrimSpecRec(uint32_t depth, PrimSpec &dst,
                                const PrimSpec &src, std::string *warn,
                                std::string *err) {
  (void)warn;

  if (depth > (1024 * 1024 * 128)) {
    PUSH_ERROR_AND_RETURN("PrimSpec tree too deep.");
  }

  DCOUT("update_from");
  DCOUT(print_prim_metas(src.metas(), 1));
  // Override metadataum
  dst.metas().update_from(src.metas());
  DCOUT("update_from done");

  // Override properties
  for (const auto &prop : src.props()) {
    // replace
    dst.props()[prop.first] = prop.second;
  }

  // Override child primspecs.
  for (auto &child : dst.children()) {
    auto src_it = std::find_if(
        src.children().begin(), src.children().end(),
        [&child](const PrimSpec &ps) { return ps.name() == child.name(); });

    if (src_it != src.children().end()) {
      if (!OverridePrimSpecRec(depth + 1, child, (*src_it), warn, err)) {
        return false;
      }
    }
  }

  // Add child not exists in dst.
  for (auto &child : src.children()) {
    auto dst_it = std::find_if(
        dst.children().begin(), dst.children().end(),
        [&child](const PrimSpec &ps) { return ps.name() == child.name(); });

    if (dst_it == dst.children().end()) {
      dst.children().push_back(child);
    }
  }

  return true;
}